

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_tests.cpp
# Opt level: O0

void __thiscall compress_tests::compress_amounts::test_method(compress_amounts *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  uint64_t i_4;
  uint64_t i_3;
  uint64_t i_2;
  uint64_t i_1;
  uint64_t i;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffff918;
  undefined7 in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff927;
  assertion_result *in_stack_fffffffffffff928;
  const_string *in_stack_fffffffffffff940;
  const_string *msg;
  lazy_ostream *in_stack_fffffffffffff948;
  const_string *in_stack_fffffffffffff950;
  unit_test_log_t *in_stack_fffffffffffff958;
  ulong local_570;
  ulong local_568;
  ulong local_560;
  ulong local_558;
  ulong uVar2;
  const_string local_530 [2];
  lazy_ostream local_510 [2];
  assertion_result local_4f0;
  const_string local_4d8 [2];
  const_string local_4b8 [2];
  lazy_ostream local_498 [2];
  assertion_result local_478;
  unit_test_log_t local_450 [2];
  const_string local_440 [2];
  lazy_ostream local_420 [2];
  assertion_result local_400 [2];
  const_string local_3c8 [2];
  lazy_ostream local_3a8 [2];
  assertion_result local_388 [2];
  const_string local_350 [2];
  lazy_ostream local_330 [2];
  assertion_result local_310 [2];
  const_string local_2d8 [2];
  lazy_ostream local_2b8 [2];
  assertion_result local_298 [2];
  const_string local_260 [2];
  lazy_ostream local_240 [2];
  assertion_result local_220 [2];
  const_string local_1e8 [2];
  lazy_ostream local_1c8 [2];
  assertion_result local_1a8 [2];
  const_string local_170 [2];
  lazy_ostream local_150 [2];
  assertion_result local_130 [2];
  const_string local_f8 [2];
  lazy_ostream local_d8 [2];
  assertion_result local_b8 [2];
  const_string local_80 [2];
  lazy_ostream local_60 [2];
  assertion_result local_40 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950,(size_t)in_stack_fffffffffffff948
               ,in_stack_fffffffffffff940);
    TestPair((uint64_t)in_stack_fffffffffffff928,
             CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff928,(bool)in_stack_fffffffffffff927);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (basic_cstring<const_char> *)in_stack_fffffffffffff918);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    in_stack_fffffffffffff918 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_40,local_60,local_80,0x2b,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff918);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff918);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950,(size_t)in_stack_fffffffffffff948
               ,in_stack_fffffffffffff940);
    TestPair((uint64_t)in_stack_fffffffffffff928,
             CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff928,(bool)in_stack_fffffffffffff927);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (basic_cstring<const_char> *)in_stack_fffffffffffff918);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    in_stack_fffffffffffff918 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_b8,local_d8,local_f8,0x2c,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff918);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff918);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950,(size_t)in_stack_fffffffffffff948
               ,in_stack_fffffffffffff940);
    TestPair((uint64_t)in_stack_fffffffffffff928,
             CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff928,(bool)in_stack_fffffffffffff927);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (basic_cstring<const_char> *)in_stack_fffffffffffff918);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    in_stack_fffffffffffff918 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_130,local_150,local_170,0x2d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff918);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff918);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950,(size_t)in_stack_fffffffffffff948
               ,in_stack_fffffffffffff940);
    TestPair((uint64_t)in_stack_fffffffffffff928,
             CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff928,(bool)in_stack_fffffffffffff927);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (basic_cstring<const_char> *)in_stack_fffffffffffff918);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    in_stack_fffffffffffff918 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1a8,local_1c8,local_1e8,0x2e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff918);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff918);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950,(size_t)in_stack_fffffffffffff948
               ,in_stack_fffffffffffff940);
    TestPair((uint64_t)in_stack_fffffffffffff928,
             CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff928,(bool)in_stack_fffffffffffff927);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (basic_cstring<const_char> *)in_stack_fffffffffffff918);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    in_stack_fffffffffffff918 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_220,local_240,local_260,0x2f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff918);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff918);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff918);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff958,in_stack_fffffffffffff950,(size_t)in_stack_fffffffffffff948
               ,in_stack_fffffffffffff940);
    TestPair((uint64_t)in_stack_fffffffffffff928,
             CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff928,(bool)in_stack_fffffffffffff927);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (basic_cstring<const_char> *)in_stack_fffffffffffff918);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
               (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (unsigned_long)in_stack_fffffffffffff918);
    in_stack_fffffffffffff918 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_298,local_2b8,local_2d8,0x30,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff918);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff918);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (uVar2 = 1; uVar2 < 0x186a1; uVar2 = uVar2 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
                 (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (unsigned_long)in_stack_fffffffffffff918);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff918);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                 (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      TestEncode((uint64_t)in_stack_fffffffffffff928);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff928,(bool)in_stack_fffffffffffff927);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
                 (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (unsigned_long)in_stack_fffffffffffff918);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff918);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
                 (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (unsigned_long)in_stack_fffffffffffff918);
      in_stack_fffffffffffff918 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_310,local_330,local_350,0x33,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffff918);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff918);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  for (local_558 = 1; local_558 < 0x2711; local_558 = local_558 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
                 (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (unsigned_long)in_stack_fffffffffffff918);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff918);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                 (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      TestEncode((uint64_t)in_stack_fffffffffffff928);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff928,(bool)in_stack_fffffffffffff927);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
                 (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (unsigned_long)in_stack_fffffffffffff918);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff918);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
                 (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (unsigned_long)in_stack_fffffffffffff918);
      in_stack_fffffffffffff918 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_388,local_3a8,local_3c8,0x36,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffff918);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff918);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  for (local_560 = 1; local_560 < 0x2711; local_560 = local_560 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
                 (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (unsigned_long)in_stack_fffffffffffff918);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff918);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                 (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      TestEncode((uint64_t)in_stack_fffffffffffff928);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff928,(bool)in_stack_fffffffffffff927);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
                 (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (unsigned_long)in_stack_fffffffffffff918);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff918);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
                 (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (unsigned_long)in_stack_fffffffffffff918);
      in_stack_fffffffffffff918 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_400,local_420,local_440,0x39,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffff918);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff918);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  for (local_568 = 1; local_568 < 0x668a1; local_568 = local_568 + 1) {
    do {
      in_stack_fffffffffffff958 = local_450;
      in_stack_fffffffffffff950 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
                 (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (unsigned_long)in_stack_fffffffffffff918);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff918);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                 (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      TestEncode((uint64_t)in_stack_fffffffffffff928);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff928,(bool)in_stack_fffffffffffff927);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
                 (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (unsigned_long)in_stack_fffffffffffff918);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff918);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
                 (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (unsigned_long)in_stack_fffffffffffff918);
      in_stack_fffffffffffff918 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_478,local_498,local_4b8,0x3c,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffff918);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff918);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  for (local_570 = 0; local_570 < 100000; local_570 = local_570 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
                 (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (unsigned_long)in_stack_fffffffffffff918);
      msg = local_4d8;
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff918);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                 (size_t)in_stack_fffffffffffff948,msg);
      TestDecode((uint64_t)in_stack_fffffffffffff928);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff928,(bool)in_stack_fffffffffffff927);
      in_stack_fffffffffffff948 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
                 (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (unsigned_long)in_stack_fffffffffffff918);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff918);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff928,
                 (pointer)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (unsigned_long)in_stack_fffffffffffff918);
      in_stack_fffffffffffff918 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_4f0,local_510,local_530,0x3f,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffff918);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff918);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(compress_amounts)
{
    BOOST_CHECK(TestPair(            0,       0x0));
    BOOST_CHECK(TestPair(            1,       0x1));
    BOOST_CHECK(TestPair(         CENT,       0x7));
    BOOST_CHECK(TestPair(         COIN,       0x9));
    BOOST_CHECK(TestPair(      50*COIN,      0x32));
    BOOST_CHECK(TestPair(21000000*COIN, 0x1406f40));

    for (uint64_t i = 1; i <= NUM_MULTIPLES_UNIT; i++)
        BOOST_CHECK(TestEncode(i));

    for (uint64_t i = 1; i <= NUM_MULTIPLES_CENT; i++)
        BOOST_CHECK(TestEncode(i * CENT));

    for (uint64_t i = 1; i <= NUM_MULTIPLES_1BTC; i++)
        BOOST_CHECK(TestEncode(i * COIN));

    for (uint64_t i = 1; i <= NUM_MULTIPLES_50BTC; i++)
        BOOST_CHECK(TestEncode(i * 50 * COIN));

    for (uint64_t i = 0; i < 100000; i++)
        BOOST_CHECK(TestDecode(i));
}